

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

int __thiscall pstore::database::open(database *this,char *__file,int __oflag,...)

{
  pointer pcVar1;
  pointer pcVar2;
  _func_int **pp_Var3;
  file_handle *this_00;
  undefined8 uVar4;
  int iVar5;
  uint __oflag_00;
  int __oflag_01;
  char *__new;
  string *path;
  ulong uVar6;
  shared_ptr<pstore::file::file_handle> temporary_file;
  deleter temp_file_deleter;
  file_handle *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  string local_a0;
  undefined1 local_80 [72];
  bool local_38;
  
  this->_vptr_database = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pstore::file::file_handle,std::allocator<pstore::file::file_handle>,std::__cxx11::string_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->storage_,(file_handle **)this,
             (allocator<pstore::file::file_handle> *)local_80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__file);
  __oflag_00 = (uint)(__oflag - 1U < 2);
  pstore::file::file_handle::open((file_handle *)this->_vptr_database,(char *)0x1,__oflag_00,0);
  if (*(int *)(this->_vptr_database + 5) != -1) {
LAB_0010ddce:
    return (int)this;
  }
  if (__oflag != 1) {
    raise<std::errc,std::__cxx11::string>
              (no_such_file_or_directory,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__file);
  }
  local_b0 = (file_handle *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pstore::file::file_handle,std::allocator<pstore::file::file_handle>>
            (&local_a8,&local_b0,(allocator<pstore::file::file_handle> *)local_80);
  this_00 = local_b0;
  pstore::path::posix::dir_name((string *)local_80,(string *)__file);
  pstore::file::file_handle::open(this_00,local_80,__oflag_01);
  pcVar1 = local_80 + 0x10;
  if ((pointer)local_80._0_8_ != pcVar1) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
  }
  pcVar2 = (local_b0->path_)._M_dataplus._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar2,pcVar2 + (local_b0->path_)._M_string_length);
  path = &local_a0;
  pstore::file::posix::deleter::deleter((deleter *)local_80,path);
  iVar5 = (int)path;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    uVar6 = local_a0.field_2._M_allocated_capacity + 1;
    operator_delete(local_a0._M_dataplus._M_p,uVar6);
    iVar5 = (int)uVar6;
  }
  build_new_store(&local_b0->super_file_base);
  pstore::file::file_handle::close(local_b0,iVar5);
  pstore::file::file_handle::rename(local_b0,__file,__new);
  local_38 = true;
  pstore::file::posix::deleter::~deleter((deleter *)local_80);
  if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
  }
  pstore::file::file_handle::open((file_handle *)this->_vptr_database,(char *)0x1,__oflag_00,1);
  pp_Var3 = this->_vptr_database;
  if (*(int *)(pp_Var3 + 5) != -1) {
    local_80._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pp_Var3[1],pp_Var3[2] + (long)pp_Var3[1]);
    uVar4 = local_80._0_8_;
    if ((pointer)local_80._8_8_ == *(pointer *)(__file + 8)) {
      if ((pointer)local_80._8_8_ != (pointer)0x0) {
        iVar5 = bcmp((void *)local_80._0_8_,*(void **)__file,local_80._8_8_);
        if (iVar5 != 0) goto LAB_0010dde3;
      }
      if ((pointer)uVar4 != pcVar1) {
        operator_delete((void *)uVar4,local_80._16_8_ + 1);
      }
      goto LAB_0010ddce;
    }
  }
LAB_0010dde3:
  assert_failed("file->is_open () && file->path () == path",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/database.cpp"
                ,0x12e);
}

Assistant:

auto database::open (std::string const & path, access_mode const am)
        -> std::shared_ptr<file::file_handle> {

        using present_mode = file::file_handle::present_mode;
        auto const create_mode = file::file_handle::create_mode::open_existing;
        auto const write_mode =
            (am == access_mode::writable || am == access_mode::writeable_no_create)
                ? file::file_handle::writable_mode::read_write
                : file::file_handle::writable_mode::read_only;

        auto file = std::make_shared<file::file_handle> (path);
        file->open (create_mode, write_mode, present_mode::allow_not_found);
        if (file->is_open ()) {
            return file;
        }

        if (am != access_mode::writable) {
            raise (std::errc::no_such_file_or_directory, path);
        }

        // We didn't find the file so will have to create a new one.
        //
        // To ensure that this operation is as close to atomic as the host OS allows, we create
        // a temporary file in the same directory but with a random name. (This approach was
        // chosen because this directory most likely has the same permissions and is on the same
        // physical volume as the final file). We then populate that file with the basic data
        // structures and rename it to the final destination.
        {
            auto const temporary_file = std::make_shared<file::file_handle> ();
            temporary_file->open (file::file_handle::unique{}, path::dir_name (path));
            file::deleter temp_file_deleter (temporary_file->path ());
            // Fill the file with its initial contents.
            database::build_new_store (*temporary_file);
            temporary_file->close ();
            temporary_file->rename (path);
            // The temporary file will no longer be found anyway (we just renamed it).
            temp_file_deleter.release ();
        }
        file->open (create_mode, write_mode, file::file_handle::present_mode::must_exist);
        PSTORE_ASSERT (file->is_open () && file->path () == path);
        return file;
    }